

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.h
# Opt level: O3

cbtScalar __thiscall
cbtCollisionWorld::AllHitsRayResultCallback::addSingleResult
          (AllHitsRayResultCallback *this,LocalRayResult *rayResult,bool normalInWorldSpace)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  float fVar6;
  undefined8 uVar7;
  cbtCollisionObject **ptr;
  cbtVector3 *pcVar8;
  float *ptr_00;
  float fVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  cbtCollisionObject **ppcVar12;
  cbtVector3 *pcVar13;
  float *pfVar14;
  cbtCollisionObject *pcVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pcVar15 = rayResult->m_collisionObject;
  (this->super_RayResultCallback).m_collisionObject = pcVar15;
  uVar11 = (this->m_collisionObjects).m_size;
  if (uVar11 == (this->m_collisionObjects).m_capacity) {
    iVar18 = 1;
    if (uVar11 != 0) {
      iVar18 = uVar11 * 2;
    }
    if ((int)uVar11 < iVar18) {
      if (iVar18 == 0) {
        ppcVar12 = (cbtCollisionObject **)0x0;
      }
      else {
        ppcVar12 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar18 << 3,0x10);
        uVar11 = (this->m_collisionObjects).m_size;
      }
      if (0 < (int)uVar11) {
        uVar17 = 0;
        do {
          ppcVar12[uVar17] = (this->m_collisionObjects).m_data[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar11 != uVar17);
      }
      ptr = (this->m_collisionObjects).m_data;
      if ((ptr != (cbtCollisionObject **)0x0) && ((this->m_collisionObjects).m_ownsMemory == true))
      {
        cbtAlignedFreeInternal(ptr);
        uVar11 = (this->m_collisionObjects).m_size;
      }
      (this->m_collisionObjects).m_ownsMemory = true;
      (this->m_collisionObjects).m_data = ppcVar12;
      (this->m_collisionObjects).m_capacity = iVar18;
      pcVar15 = rayResult->m_collisionObject;
    }
  }
  (this->m_collisionObjects).m_data[(int)uVar11] = pcVar15;
  (this->m_collisionObjects).m_size = uVar11 + 1;
  if (normalInWorldSpace) {
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(rayResult->m_hitNormalLocal).m_floats;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)((rayResult->m_hitNormalLocal).m_floats + 2);
  }
  else {
    pcVar15 = (this->super_RayResultCallback).m_collisionObject;
    fVar6 = (rayResult->m_hitNormalLocal).m_floats[1];
    cVar4 = (rayResult->m_hitNormalLocal).m_floats[0];
    cVar5 = (rayResult->m_hitNormalLocal).m_floats[2];
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar15->m_worldTransform).m_basis.m_el[0].
                                                     m_floats[1])),ZEXT416((uint)cVar4),
                              ZEXT416((uint)(pcVar15->m_worldTransform).m_basis.m_el[0].m_floats[0])
                             );
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar15->m_worldTransform).m_basis.m_el[1].
                                                     m_floats[1])),ZEXT416((uint)cVar4),
                              ZEXT416((uint)(pcVar15->m_worldTransform).m_basis.m_el[1].m_floats[0])
                             );
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar15->m_worldTransform).m_basis.m_el[2].
                                                     m_floats[1])),ZEXT416((uint)cVar4),
                              ZEXT416((uint)(pcVar15->m_worldTransform).m_basis.m_el[2].m_floats[0])
                             );
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar5),
                              ZEXT416((uint)(pcVar15->m_worldTransform).m_basis.m_el[2].m_floats[2])
                             );
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar5),
                              ZEXT416((uint)(pcVar15->m_worldTransform).m_basis.m_el[0].m_floats[2])
                             );
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar5),
                              ZEXT416((uint)(pcVar15->m_worldTransform).m_basis.m_el[1].m_floats[2])
                             );
    auVar20 = vinsertps_avx(auVar20,auVar19,0x10);
    auVar19._0_4_ = auVar21._0_4_;
    auVar19._4_12_ = SUB1612(auVar10 << 0x40,4);
  }
  uVar11 = (this->m_hitNormalWorld).m_size;
  if (uVar11 == (this->m_hitNormalWorld).m_capacity) {
    iVar18 = 1;
    if (uVar11 != 0) {
      iVar18 = uVar11 * 2;
    }
    if ((int)uVar11 < iVar18) {
      if (iVar18 == 0) {
        pcVar13 = (cbtVector3 *)0x0;
      }
      else {
        pcVar13 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar18 << 4,0x10);
        uVar11 = (this->m_hitNormalWorld).m_size;
      }
      if (0 < (int)uVar11) {
        lVar16 = 0;
        do {
          puVar2 = (undefined8 *)((long)((this->m_hitNormalWorld).m_data)->m_floats + lVar16);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)pcVar13->m_floats + lVar16);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar11 << 4 != lVar16);
      }
      pcVar8 = (this->m_hitNormalWorld).m_data;
      if ((pcVar8 != (cbtVector3 *)0x0) && ((this->m_hitNormalWorld).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(pcVar8);
      }
      (this->m_hitNormalWorld).m_ownsMemory = true;
      (this->m_hitNormalWorld).m_data = pcVar13;
      (this->m_hitNormalWorld).m_capacity = iVar18;
      uVar11 = (this->m_hitNormalWorld).m_size;
    }
  }
  auVar20 = vmovlhps_avx(auVar20,auVar19);
  *(undefined1 (*) [16])(this->m_hitNormalWorld).m_data[(int)uVar11].m_floats = auVar20;
  piVar1 = &(this->m_hitNormalWorld).m_size;
  *piVar1 = *piVar1 + 1;
  fVar6 = rayResult->m_hitFraction;
  uVar7 = *(undefined8 *)(this->m_rayToWorld).m_floats;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(this->m_rayFromWorld).m_floats;
  uVar11 = (this->m_hitPointWorld).m_size;
  fVar9 = 1.0 - fVar6;
  auVar22._0_4_ = fVar6 * (float)uVar7;
  auVar22._4_4_ = fVar6 * (float)((ulong)uVar7 >> 0x20);
  auVar22._8_4_ = fVar6 * 0.0;
  auVar22._12_4_ = fVar6 * 0.0;
  auVar23._4_4_ = fVar9;
  auVar23._0_4_ = fVar9;
  auVar23._8_4_ = fVar9;
  auVar23._12_4_ = fVar9;
  auVar20 = vfmadd213ps_fma(auVar23,auVar21,auVar22);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->m_rayToWorld).m_floats[2])),
                            ZEXT416((uint)fVar9),ZEXT416((uint)(this->m_rayFromWorld).m_floats[2]));
  if (uVar11 == (this->m_hitPointWorld).m_capacity) {
    iVar18 = 1;
    if (uVar11 != 0) {
      iVar18 = uVar11 * 2;
    }
    if ((int)uVar11 < iVar18) {
      if (iVar18 == 0) {
        pcVar13 = (cbtVector3 *)0x0;
      }
      else {
        pcVar13 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar18 << 4,0x10);
        uVar11 = (this->m_hitPointWorld).m_size;
      }
      if (0 < (int)uVar11) {
        lVar16 = 0;
        do {
          puVar2 = (undefined8 *)((long)((this->m_hitPointWorld).m_data)->m_floats + lVar16);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)pcVar13->m_floats + lVar16);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar11 << 4 != lVar16);
      }
      pcVar8 = (this->m_hitPointWorld).m_data;
      if ((pcVar8 != (cbtVector3 *)0x0) && ((this->m_hitPointWorld).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(pcVar8);
      }
      (this->m_hitPointWorld).m_ownsMemory = true;
      (this->m_hitPointWorld).m_data = pcVar13;
      (this->m_hitPointWorld).m_capacity = iVar18;
      uVar11 = (this->m_hitPointWorld).m_size;
    }
  }
  pcVar13 = (this->m_hitPointWorld).m_data;
  uVar7 = vmovlps_avx(auVar20);
  *(undefined8 *)pcVar13[(int)uVar11].m_floats = uVar7;
  pcVar13[(int)uVar11].m_floats[2] = auVar19._0_4_;
  piVar1 = &(this->m_hitPointWorld).m_size;
  *piVar1 = *piVar1 + 1;
  uVar11 = (this->m_hitFractions).m_size;
  if (uVar11 != (this->m_hitFractions).m_capacity) goto LAB_007f1dd1;
  iVar18 = 1;
  if (uVar11 != 0) {
    iVar18 = uVar11 * 2;
  }
  if (iVar18 <= (int)uVar11) goto LAB_007f1dd1;
  if (iVar18 == 0) {
    pfVar14 = (float *)0x0;
  }
  else {
    pfVar14 = (float *)cbtAlignedAllocInternal((long)iVar18 << 2,0x10);
    uVar11 = (this->m_hitFractions).m_size;
  }
  ptr_00 = (this->m_hitFractions).m_data;
  if ((int)uVar11 < 1) {
    if (ptr_00 != (float *)0x0) goto LAB_007f1da9;
  }
  else {
    uVar17 = 0;
    do {
      pfVar14[uVar17] = ptr_00[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar11 != uVar17);
LAB_007f1da9:
    if ((this->m_hitFractions).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_00);
      uVar11 = (this->m_hitFractions).m_size;
    }
  }
  (this->m_hitFractions).m_ownsMemory = true;
  (this->m_hitFractions).m_data = pfVar14;
  (this->m_hitFractions).m_capacity = iVar18;
LAB_007f1dd1:
  (this->m_hitFractions).m_data[(int)uVar11] = rayResult->m_hitFraction;
  (this->m_hitFractions).m_size = uVar11 + 1;
  return (this->super_RayResultCallback).m_closestHitFraction;
}

Assistant:

virtual cbtScalar addSingleResult(LocalRayResult& rayResult, bool normalInWorldSpace)
		{
			m_collisionObject = rayResult.m_collisionObject;
			m_collisionObjects.push_back(rayResult.m_collisionObject);
			cbtVector3 hitNormalWorld;
			if (normalInWorldSpace)
			{
				hitNormalWorld = rayResult.m_hitNormalLocal;
			}
			else
			{
				///need to transform normal into worldspace
				hitNormalWorld = m_collisionObject->getWorldTransform().getBasis() * rayResult.m_hitNormalLocal;
			}
			m_hitNormalWorld.push_back(hitNormalWorld);
			cbtVector3 hitPointWorld;
			hitPointWorld.setInterpolate3(m_rayFromWorld, m_rayToWorld, rayResult.m_hitFraction);
			m_hitPointWorld.push_back(hitPointWorld);
			m_hitFractions.push_back(rayResult.m_hitFraction);
			return m_closestHitFraction;
		}